

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format_number.h
# Opt level: O2

void cppcms::impl::format_traits<unsigned_long,_true>::format(unsigned_long v,char *output,size_t n)

{
  undefined1 uVar1;
  char *pcVar2;
  undefined1 *puVar3;
  undefined8 uStack_40;
  char buf [29];
  
  pcVar2 = buf;
  if (v == 0) {
    buf[0] = '0';
    buf[1] = '\0';
  }
  else {
    puVar3 = (undefined1 *)((long)&uStack_40 + 7);
    for (; v != 0; v = v / 10) {
      puVar3[1] = (byte)(v % 10) | 0x30;
      puVar3 = puVar3 + 1;
    }
    puVar3[1] = 0;
    for (; pcVar2 < puVar3; pcVar2 = pcVar2 + 1) {
      uVar1 = *pcVar2;
      *pcVar2 = *puVar3;
      *puVar3 = uVar1;
      puVar3 = puVar3 + -1;
    }
  }
  uStack_40 = 0x25d3ab;
  strncpy(output,buf,n - 1);
  output[n - 1] = '\0';
  return;
}

Assistant:

static void format(Value v,char *output,size_t n)
			{
				char buf[std::numeric_limits<Value>::digits10 + 10];
				char *begin = buf;
				if(v < 0) {
					*begin ++ = '-';
				}
				if(v == 0) {
					*begin ++ ='0';
					*begin = 0;
				}
				else {
					char *p=begin;
					while(v != 0) {
						int digit = v % 10;
						v/=10;
						if(digit < 0)
							*p++='0' - digit;
						else
							*p++='0' + digit;
					}
					*p-- = 0;
					while(begin < p) {
						std::swap(*begin,*p);
						begin++;
						p--;
					}
				}
				strncpy(output,buf,n-1);
				output[n-1] = 0;
			}